

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertInt::test
          (ShaderBitfieldOperationCaseBitfieldInsertInt *this,Data *data)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  iVar1 = this->m_components;
  bVar5 = iVar1 < 1;
  if (0 < iVar1) {
    uVar8 = ~(-1 << ((byte)data->bits & 0x1f));
    if (data->bits == 0x20) {
      uVar8 = 0xffffffff;
    }
    bVar6 = (byte)data->offset;
    uVar9 = ~(uVar8 << (bVar6 & 0x1f));
    if (data->outIvec4[0] ==
        ((data->in2Ivec4[0] & uVar8) << (bVar6 & 0x1f) | data->inIvec4[0] & uVar9)) {
      lVar7 = 0;
      do {
        iVar10 = (int)lVar7;
        if (iVar1 + -1 == iVar10) break;
        lVar2 = lVar7 + 1;
        lVar3 = lVar7 + 1;
        lVar4 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (data->outIvec4[lVar4] ==
               ((data->in2Ivec4[lVar3] & uVar8) << (bVar6 & 0x1f) | data->inIvec4[lVar2] & uVar9));
      bVar5 = iVar1 <= iVar10 + 1;
    }
  }
  return bVar5;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint mask = (data->bits == 32) ? ~0u : (1 << data->bits) - 1;
			GLint  expected =
				(data->inIvec4[i] & ~(mask << data->offset)) | ((data->in2Ivec4[i] & mask) << data->offset);
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}